

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_im2col_back_f32(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  int *piVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int *in_RSI;
  int *in_RDI;
  float *dst_data;
  float *grad_in;
  int64_t tmph;
  int64_t ioh;
  int64_t iow;
  int64_t tmpw;
  int64_t ikw;
  int64_t ikh;
  float grad;
  int64_t iiw;
  int64_t iih;
  int64_t iic;
  int64_t in;
  float *wdata;
  int ofs1;
  int ofs0;
  int64_t OW;
  int64_t OH;
  int64_t KW;
  int64_t KH;
  int64_t IW;
  int64_t IH;
  int64_t IC;
  int64_t N;
  int nth;
  int ith;
  bool is_2D;
  int32_t d1;
  int32_t d0;
  int32_t p1;
  int32_t p0;
  int32_t s1;
  int32_t s0;
  size_t nb3;
  size_t nb2;
  size_t nb1;
  size_t nb0;
  int64_t ne3;
  int64_t ne2;
  int64_t ne1;
  int64_t ne0;
  size_t nb13;
  size_t nb12;
  size_t nb11;
  size_t nb10;
  int64_t ne13;
  int64_t ne12;
  int64_t ne11;
  int64_t ne10;
  size_t nb03;
  size_t nb02;
  size_t nb01;
  size_t nb00;
  int64_t ne03;
  int64_t ne02;
  int64_t ne01;
  int64_t ne00;
  ggml_tensor *src1;
  ggml_tensor *src0;
  int local_1f8;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1a8;
  long local_190;
  long local_188;
  float local_17c;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  
  piVar11 = *(int **)(in_RSI + 0x26);
  piVar12 = *(int **)(in_RSI + 0x28);
  if (*piVar11 != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x16fd,"GGML_ASSERT(%s) failed","src0->type == GGML_TYPE_F32");
  }
  if (*piVar12 != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x16fe,"GGML_ASSERT(%s) failed","src1->type == GGML_TYPE_F32");
  }
  if (*in_RSI != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x16ff,"GGML_ASSERT(%s) failed","dst->type == GGML_TYPE_F32");
  }
  lVar13 = *(long *)(piVar11 + 6);
  local_1e8 = *(long *)(piVar11 + 8);
  lVar14 = *(long *)(piVar12 + 4);
  local_1e0 = *(long *)(piVar12 + 6);
  lVar15 = *(long *)(in_RSI + 4);
  lVar16 = *(long *)(in_RSI + 8);
  lVar17 = *(long *)(in_RSI + 10);
  iVar10 = (int)*(undefined8 *)(in_RSI + 0x12);
  iVar1 = in_RSI[0x15];
  iVar2 = in_RSI[0x16];
  iVar3 = in_RSI[0x17];
  iVar4 = in_RSI[0x18];
  iVar5 = in_RSI[0x19];
  iVar6 = in_RSI[0x1a];
  iVar7 = in_RSI[0x1b];
  iVar8 = *in_RDI;
  iVar9 = in_RDI[1];
  local_1f8 = (int)*(undefined8 *)(in_RSI + 0x10);
  local_1d8 = *(long *)(in_RSI + 6);
  if (iVar7 != 1) {
    local_1d8 = 1;
    local_1e0 = 1;
    local_1e8 = 1;
    local_1f8 = (int)*(undefined8 *)(in_RSI + 0xe);
    iVar10 = (int)*(undefined8 *)(in_RSI + 0x10);
    lVar17 = lVar16;
    lVar16 = *(long *)(in_RSI + 6);
  }
  if (*(long *)(in_RSI + 0xc) != 4) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x171c,"GGML_ASSERT(%s) failed","nb0 == sizeof(float)");
  }
  lVar18 = *(long *)(in_RSI + 0x3e);
  local_160 = 0;
  do {
    if (lVar17 <= local_160) {
      return;
    }
    for (local_168 = (long)iVar8; local_168 < lVar16; local_168 = iVar9 + local_168) {
      for (local_170 = 0; local_170 < local_1d8; local_170 = local_170 + 1) {
        for (local_178 = 0; local_178 < lVar15; local_178 = local_178 + 1) {
          local_17c = 0.0;
          for (local_188 = 0; local_188 < local_1e0; local_188 = local_188 + 1) {
            for (local_190 = 0; local_190 < lVar14; local_190 = local_190 + 1) {
              lVar19 = (local_178 + iVar3) - local_190 * iVar5;
              if (lVar19 % (long)iVar1 == 0) {
                lVar19 = lVar19 / (long)iVar1;
                if (iVar7 != 1) {
                  local_1a8 = 0;
                }
                else {
                  local_1a8 = (local_170 + iVar4) - local_188 * iVar6;
                  if (local_1a8 % (long)iVar2 != 0) goto LAB_001a65ce;
                  local_1a8 = local_1a8 / (long)iVar2;
                }
                if ((((-1 < lVar19) && (lVar19 < lVar13)) && (-1 < local_1a8)) &&
                   (local_1a8 < local_1e8)) {
                  local_17c = *(float *)(*(long *)(piVar11 + 0x3e) +
                                         (local_160 * local_1e8 * lVar13 + local_1a8 * lVar13 +
                                         lVar19) * lVar16 * local_1e0 * lVar14 * 4 +
                                        (local_168 * local_1e0 * lVar14 + local_188 * lVar14 +
                                        local_190) * 4) + local_17c;
                }
              }
LAB_001a65ce:
            }
          }
          *(float *)(lVar18 + local_160 * iVar10 + local_168 * local_1f8 +
                    (local_170 * lVar15 + local_178) * 4) = local_17c;
        }
      }
    }
    local_160 = local_160 + 1;
  } while( true );
}

Assistant:

void ggml_compute_forward_im2col_back_f32(
        const ggml_compute_params * params,
              ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0]; // gradients of forward pass output
    const ggml_tensor * src1 = dst->src[1]; // convolution kernel

    GGML_ASSERT(src0->type == GGML_TYPE_F32);
    GGML_ASSERT(src1->type == GGML_TYPE_F32);
    GGML_ASSERT( dst->type == GGML_TYPE_F32);

    GGML_TENSOR_BINARY_OP_LOCALS;

    const int32_t s0 = ((const int32_t *)(dst->op_params))[0];
    const int32_t s1 = ((const int32_t *)(dst->op_params))[1];
    const int32_t p0 = ((const int32_t *)(dst->op_params))[2];
    const int32_t p1 = ((const int32_t *)(dst->op_params))[3];
    const int32_t d0 = ((const int32_t *)(dst->op_params))[4];
    const int32_t d1 = ((const int32_t *)(dst->op_params))[5];
    const bool is_2D = ((const int32_t *)(dst->op_params))[6] == 1;

    const int ith = params->ith;
    const int nth = params->nth;

    const int64_t N  = is_2D ? ne3 : ne2;
    const int64_t IC = is_2D ? ne2 : ne1;
    const int64_t IH = is_2D ? ne1 : 1;
    const int64_t IW = ne0;

    const int64_t KH = is_2D ? ne11 : 1;
    const int64_t KW = ne10;

    const int64_t OH = is_2D ? ne02 : 1;
    const int64_t OW = ne01;

    int ofs0 = is_2D ? nb3 : nb2;
    int ofs1 = is_2D ? nb2 : nb1;

    GGML_ASSERT(nb0  == sizeof(float));

    // im2col: [N, IC, IH, IW] => [N, OH, OW, IC*KH*KW]
    {
        float * const wdata = (float *) dst->data;

        for (int64_t in = 0; in < N; in++) {
            for (int64_t iic = ith; iic < IC; iic += nth) {
                for (int64_t iih = 0; iih < IH; iih++) {
                    for (int64_t iiw = 0; iiw < IW; iiw++) {

                        // micro kernel
                        float grad = 0.0f;
                        for (int64_t ikh = 0; ikh < KH; ikh++) {
                            for (int64_t ikw = 0; ikw < KW; ikw++) {
                                // For s0 > 1 some values were skipped over in the forward pass.
                                // These values have tmpw % s0 != 0 and need to be skipped in the backwards pass as well.
                                const int64_t tmpw = (iiw + p0 - ikw*d0);
                                if (tmpw % s0 != 0) {
                                    continue;
                                }
                                const int64_t iow = tmpw / s0;

                                // Equivalent logic as above except for s1.
                                int64_t ioh;
                                if (is_2D) {
                                    const int64_t tmph = iih + p1 - ikh*d1;

                                    if (tmph % s1 != 0) {
                                        continue;
                                    }

                                    ioh = tmph / s1;
                                } else {
                                    ioh = 0;
                                }

                                if (iow < 0 || iow >= OW || ioh < 0 || ioh >= OH) {
                                    continue;
                                }

                                const float * const grad_in = (const float *) src0->data
                                    + (in*OH*OW + ioh*OW + iow)*(IC*KH*KW); // [IC, KH, KW]
                                grad += grad_in[iic*(KH*KW) + ikh*KW + ikw];
                            }
                        }
                        float * dst_data = (float *)((char *) wdata + (in*ofs0 + iic*ofs1)); // [IH, IW]
                        dst_data[iih*IW + iiw] = grad;
                    }
                }
            }
        }
    }
}